

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta,float obj_amp)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var4;
  rc_size rVar5;
  undefined8 extraout_RAX;
  row_iterator prVar6;
  long lVar7;
  rc_data *__last;
  rc_size rVar8;
  rc_data *__first;
  long lVar9;
  undefined1 auVar10 [64];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  rc_size sizes;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_84;
  rc_size local_80;
  int local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  _Head_base<0UL,_int_*,_false> local_60;
  row_iterator local_58;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  pair<int,_int> *local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_40;
  pair<int,_int> *local_38;
  undefined1 extraout_var [60];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_70 = obj_amp;
  local_6c = theta;
  local_68 = delta;
  local_64 = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_64,&local_68,&local_6c);
  if (first._M_current == last._M_current) {
    _Var4._M_head_impl = (row_value *)0x0;
  }
  else {
    local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    _Var4._M_head_impl = (row_value *)0x0;
    local_48 = last._M_current;
    do {
      local_84 = (first._M_current)->first;
      if (*(int *)(this + 0x88) <= local_84) {
        push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_40._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )_Var4;
      local_38 = first._M_current;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)&local_60,
                 (int)local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if (local_58 != (row_iterator)local_60._M_head_impl) {
        lVar7 = *(long *)(this + 0x50);
        prVar6 = local_58;
        do {
          *(float *)(lVar7 + (long)prVar6->value * 4) =
               local_6c * *(float *)(lVar7 + (long)prVar6->value * 4);
          prVar6 = prVar6 + 1;
        } while (prVar6 != (row_iterator)local_60._M_head_impl);
      }
      rVar5 = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)this,local_58,(row_iterator)local_60._M_head_impl,x);
      local_80 = rVar5;
      if (rVar5.r_size != 0) {
        lVar7 = 0;
        rVar8.r_size = 0;
        rVar8.c_size = 0;
        do {
          auVar10._0_4_ =
               quadratic_cost_type<float>::operator()
                         (*(quadratic_cost_type<float> **)(this + 0x80),
                          local_58[*(int *)(*(long *)(this + 0x68) + 8 + lVar7)].column,x);
          auVar10._4_60_ = extraout_var;
          auVar2 = vfmadd213ss_fma(auVar10._0_16_,ZEXT416((uint)local_70),
                                   ZEXT416(*(uint *)(*(long *)(this + 0x68) + lVar7)));
          *(int *)(*(long *)(this + 0x68) + lVar7) = auVar2._0_4_;
          rVar8 = (rc_size)((long)rVar8 + 1);
          rVar5 = (rc_size)((ulong)local_80 & 0xffffffff);
          lVar7 = lVar7 + 0xc;
        } while (rVar8 != rVar5);
      }
      if (1 < rVar5.r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x68);
        lVar7 = (long)rVar5.r_size;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar7,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar7);
        __last = __first + 1;
        lVar7 = lVar7 * 0xc + -0xc;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar7 = lVar7 + -0xc;
        } while (lVar7 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      local_74 = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::select_variables((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                                     *)this,&local_80,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_84 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_84 * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_84,
                 (int *)((long)local_84 * 0xc + *(long *)(this + 0x70)));
      if (0 < local_80.r_size) {
        lVar7 = 8;
        lVar9 = 0;
        do {
          lVar1 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,float,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar7),
                     (float *)(lVar1 + -8 + lVar7),(int *)(lVar1 + lVar7));
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0xc;
        } while (lVar9 < local_80.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_84 * 0xc),&local_74);
      bVar3 = affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)this,x,local_58,local_84,local_74,local_80.r_size,local_64,local_68);
      _Var4._M_head_impl._1_7_ =
           local_40._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl.
           _1_7_;
      _Var4._M_head_impl._0_1_ =
           (byte)local_40._M_t.
                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                 .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                 _M_head_impl | bVar3;
      first._M_current = local_38 + 1;
    } while (first._M_current != local_48);
  }
  return (bool)((byte)_Var4._M_head_impl & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }